

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingScanState<long,_long>::LoadNextGroup(BitpackingScanState<long,_long> *this)

{
  BitpackingMode BVar1;
  uint *puVar2;
  long *plVar3;
  InternalException *this_00;
  long lVar4;
  long lVar5;
  bitpacking_metadata_t group;
  long *plVar6;
  long lVar7;
  allocator local_39;
  string local_38;
  
  this->current_group_offset = 0;
  puVar2 = (uint *)this->bitpacking_metadata_ptr;
  group = (bitpacking_metadata_t)
          ((ulong)(*puVar2 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar2 + 3));
  this->current_group = group;
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar2 + -1);
  plVar3 = (long *)GetPtr(this,group);
  this->current_group_ptr = (data_ptr_t)plVar3;
  BVar1 = (this->current_group).mode;
  if (BVar1 - 3 < 3) {
    this->current_frame_of_reference = *plVar3;
    this->current_group_ptr = (data_ptr_t)(plVar3 + 1);
    lVar7 = plVar3[1];
    if (BVar1 == CONSTANT_DELTA) {
      lVar4 = 0x10;
      lVar5 = 0x4040;
      goto LAB_01a491fd;
    }
    this->current_width = (bitpacking_width_t)lVar7;
    this->current_group_ptr = (data_ptr_t)(plVar3 + 2);
    if (BVar1 != DELTA_FOR) {
      return;
    }
    lVar4 = 0x18;
    lVar5 = 0x4048;
    plVar6 = plVar3 + 2;
  }
  else {
    if (BVar1 != CONSTANT) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Invalid bitpacking mode",&local_39);
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar4 = 8;
    lVar5 = 0x4040;
    plVar6 = plVar3;
  }
  lVar7 = *plVar6;
LAB_01a491fd:
  *(long *)((long)this->decompression_buffer + lVar5 + -0x28) = lVar7;
  this->current_group_ptr = (data_ptr_t)((long)plVar3 + lVar4);
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}